

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O3

QSslCipher __thiscall
QTlsBackend::createCiphersuite
          (QTlsBackend *this,QString *suiteName,SslProtocol protocol,QString *protocolString)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  int *piVar3;
  QDebug this_00;
  char cVar4;
  long lVar5;
  long lVar6;
  QLoggingCategory *pQVar7;
  storage_type_conflict *psVar8;
  undefined8 uVar9;
  char *pcVar10;
  qsizetype qVar11;
  undefined8 *puVar12;
  QString *this_01;
  qsizetype qVar13;
  long in_FS_OFFSET;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QByteArrayView QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QStringView QVar32;
  QStringView QVar33;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  char *local_78;
  QDebug local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)this);
  if ((suiteName->d).size == 0) goto LAB_001d21ee;
  puVar1 = *(undefined1 **)this;
  *puVar1 = 0;
  QString::operator=((QString *)(puVar1 + 8),(QString *)suiteName);
  lVar6 = *(long *)this;
  *(SslProtocol *)(lVar6 + 0x90) = protocol;
  QString::operator=((QString *)(lVar6 + 0x78),(QString *)protocolString);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  uVar9 = *(undefined8 *)(*(long *)this + 0x10);
  uVar2 = *(undefined8 *)(*(long *)this + 0x18);
  local_90 = (undefined4)uVar2;
  uStack_8c = (undefined4)((ulong)uVar2 >> 0x20);
  uStack_88 = (undefined4)uVar9;
  uStack_84 = (undefined4)((ulong)uVar9 >> 0x20);
  QStringView::split(&local_68,&local_90,0x2d,0,1);
  if (local_58 < (undefined1 *)0x2) goto LAB_001d21cb;
  if (((ulong)local_58 & 0x7fffffffffffffe) == 2) {
    this_01 = (QString *)(*(long *)this + 0x28);
    pcVar10 = "RSA";
    qVar11 = 3;
    goto LAB_001d1ff3;
  }
  puVar12 = (undefined8 *)CONCAT44(uStack_5c,uStack_60);
  switch(*puVar12) {
  case 2:
    psVar8 = (storage_type_conflict *)puVar12[1];
    pcVar10 = "ECDH";
    qVar13 = 2;
    qVar11 = 2;
    break;
  case 3:
    psVar8 = (storage_type_conflict *)puVar12[1];
    pcVar10 = "ECDHE";
    qVar13 = 3;
    qVar11 = 3;
    break;
  case 4:
    psVar8 = (storage_type_conflict *)puVar12[1];
    pcVar10 = "ECDH";
    qVar13 = 4;
    qVar11 = 4;
    goto LAB_001d2067;
  case 5:
    psVar8 = (storage_type_conflict *)puVar12[1];
    pcVar10 = "ECDHE";
    qVar13 = 5;
    qVar11 = 5;
LAB_001d2067:
    QVar14.m_data = pcVar10;
    QVar14.m_size = qVar13;
    QVar32.m_data = psVar8;
    QVar32.m_size = qVar11;
    cVar4 = QtPrivate::equalStrings(QVar14,QVar32);
    if (cVar4 == '\0') goto switchD_001d2021_default;
    this_01 = (QString *)(*(long *)this + 0x28);
    pcVar10 = "ECDH";
    qVar11 = 4;
    goto LAB_001d1ff3;
  default:
    goto switchD_001d2021_default;
  }
  QVar15.m_data = pcVar10 + 2;
  QVar15.m_size = qVar13;
  QVar33.m_data = psVar8;
  QVar33.m_size = qVar11;
  cVar4 = QtPrivate::equalStrings(QVar15,QVar33);
  if (cVar4 == '\0') {
switchD_001d2021_default:
    pQVar7 = QtPrivateLogging::lcSsl();
    if (((pQVar7->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      createCiphersuite();
    }
  }
  else {
    this_01 = (QString *)(*(long *)this + 0x28);
    pcVar10 = "DH";
    qVar11 = 2;
LAB_001d1ff3:
    QVar26.m_data = pcVar10;
    QVar26.m_size = qVar11;
    QString::operator=(this_01,QVar26);
  }
  lVar6 = *(long *)this;
  if (((ulong)local_58 & 0x7fffffffffffffe) == 2) {
LAB_001d20dd:
    pcVar10 = "RSA";
    qVar11 = 3;
LAB_001d2129:
    QVar27.m_data = pcVar10;
    QVar27.m_size = qVar11;
    QString::operator=((QString *)(lVar6 + 0x40),QVar27);
  }
  else {
    QVar16.m_size = lVar6 + 8;
    QVar16.m_data = (char *)0x7;
    lVar5 = QString::indexOf(QVar16,0x263dcd,CaseInsensitive);
    lVar6 = *(long *)this;
    if (lVar5 != -1) {
      pcVar10 = "ECDSA";
      qVar11 = 5;
      goto LAB_001d2129;
    }
    QVar19.m_size = lVar6 + 8;
    QVar19.m_data = (char *)0x5;
    lVar6 = QString::indexOf(QVar19,0x263ddb,CaseInsensitive);
    if (lVar6 != -1) {
      lVar6 = *(long *)this;
      goto LAB_001d20dd;
    }
    pQVar7 = QtPrivateLogging::lcSsl();
    if (((pQVar7->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_78 = pQVar7->name;
      local_90 = 2;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      uStack_80 = 0;
      local_7c = 0;
      QMessageLogger::warning();
      this_00.stream = local_70.stream;
      QVar21.m_data = (storage_type *)0xa;
      QVar21.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar21);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      puVar12 = *(undefined8 **)(*(long *)this + 0x10);
      if (puVar12 == (undefined8 *)0x0) {
        puVar12 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_70,(ulong)puVar12);
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      QDebug::~QDebug(&local_70);
    }
  }
  QVar17.m_size = *(long *)this + 8;
  QVar17.m_data = &DAT_00000004;
  lVar5 = QString::indexOf(QVar17,0x263dec,CaseInsensitive);
  lVar6 = *(long *)this;
  if (lVar5 == -1) {
    QVar18.m_size = lVar6 + 8;
    QVar18.m_data = (char *)0x9;
    lVar6 = QString::indexOf(QVar18,0x263dfa,CaseInsensitive);
    if (lVar6 != -1) {
      QVar29.m_data = "3DES(168)";
      QVar29.m_size = 9;
      QString::operator=((QString *)(*(long *)this + 0x58),QVar29);
      lVar6 = *(long *)this;
      uVar9 = 0xa8000000a8;
      goto LAB_001d21c7;
    }
    QVar20.m_size = *(long *)this + 8;
    QVar20.m_data = (char *)0x7;
    lVar5 = QString::indexOf(QVar20,0x263e0e,CaseInsensitive);
    lVar6 = *(long *)this;
    if (lVar5 != -1) {
      pcVar10 = "AES(128)";
      goto LAB_001d2162;
    }
    QVar22.m_size = lVar6 + 8;
    QVar22.m_data = (char *)0xa;
    lVar5 = QString::indexOf(QVar22,0x263e1f,CaseInsensitive);
    lVar6 = *(long *)this;
    if (lVar5 != -1) {
      pcVar10 = "AESGCM(256)";
      qVar11 = 0xb;
LAB_001d240a:
      QVar30.m_data = pcVar10;
      QVar30.m_size = qVar11;
      QString::operator=((QString *)(lVar6 + 0x58),QVar30);
      lVar6 = *(long *)this;
      uVar9 = 0x10000000100;
      goto LAB_001d21c7;
    }
    QVar23.m_size = lVar6 + 8;
    QVar23.m_data = (char *)0x7;
    lVar5 = QString::indexOf(QVar23,0x263e36,CaseInsensitive);
    lVar6 = *(long *)this;
    if (lVar5 != -1) {
      pcVar10 = "AES(256)";
LAB_001d2405:
      qVar11 = 8;
      goto LAB_001d240a;
    }
    QVar24.m_size = lVar6 + 8;
    QVar24.m_data = (char *)0x9;
    lVar5 = QString::indexOf(QVar24,0x263e47,CaseInsensitive);
    lVar6 = *(long *)this;
    if (lVar5 != -1) {
      pcVar10 = "CHACHA20";
      goto LAB_001d2405;
    }
    QVar25.m_size = lVar6 + 8;
    QVar25.m_data = (char *)0x5;
    lVar6 = QString::indexOf(QVar25,0x263e5a,CaseInsensitive);
    if (lVar6 == -1) {
      pQVar7 = QtPrivateLogging::lcSsl();
      if (((pQVar7->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        createCiphersuite();
      }
    }
    else {
      QVar31.m_data = "NULL";
      QVar31.m_size = 4;
      QString::operator=((QString *)(*(long *)this + 0x58),QVar31);
    }
  }
  else {
    pcVar10 = "RC4(128)";
LAB_001d2162:
    QVar28.m_data = pcVar10;
    QVar28.m_size = 8;
    QString::operator=((QString *)(lVar6 + 0x58),QVar28);
    lVar6 = *(long *)this;
    uVar9 = 0x8000000080;
LAB_001d21c7:
    *(undefined8 *)(lVar6 + 0x20) = uVar9;
  }
LAB_001d21cb:
  piVar3 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),0x10,0x10);
    }
  }
LAB_001d21ee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
         (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)this;
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &suiteName, QSsl::SslProtocol protocol,
                                          const QString &protocolString)
{
    QSslCipher ciph;

    if (!suiteName.size())
        return ciph;

    ciph.d->isNull = false;
    ciph.d->name = suiteName;
    ciph.d->protocol = protocol;
    ciph.d->protocolString = protocolString;

    const auto bits = QStringView{ciph.d->name}.split(u'-');
    if (bits.size() >= 2) {
        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->keyExchangeMethod = "RSA"_L1;
        else if (bits.front() == "DH"_L1 || bits.front() == "DHE"_L1)
            ciph.d->keyExchangeMethod = "DH"_L1;
        else if (bits.front() == "ECDH"_L1 || bits.front() == "ECDHE"_L1)
            ciph.d->keyExchangeMethod = "ECDH"_L1;
        else
            qCWarning(lcSsl) << "Unknown Kx" << ciph.d->name;

        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->authenticationMethod = "RSA"_L1;
        else if (ciph.d->name.contains("-ECDSA-"_L1))
            ciph.d->authenticationMethod = "ECDSA"_L1;
        else if (ciph.d->name.contains("-RSA-"_L1))
            ciph.d->authenticationMethod = "RSA"_L1;
        else
            qCWarning(lcSsl) << "Unknown Au" << ciph.d->name;

        if (ciph.d->name.contains("RC4-"_L1)) {
            ciph.d->encryptionMethod = "RC4(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("DES-CBC3-"_L1)) {
            ciph.d->encryptionMethod = "3DES(168)"_L1;
            ciph.d->bits = 168;
            ciph.d->supportedBits = 168;
        } else if (ciph.d->name.contains("AES128-"_L1)) {
            ciph.d->encryptionMethod = "AES(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("AES256-GCM"_L1)) {
            ciph.d->encryptionMethod = "AESGCM(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("AES256-"_L1)) {
            ciph.d->encryptionMethod = "AES(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("CHACHA20-"_L1)) {
            ciph.d->encryptionMethod = "CHACHA20"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("NULL-"_L1)) {
            ciph.d->encryptionMethod = "NULL"_L1;
        } else {
            qCWarning(lcSsl) << "Unknown Enc" << ciph.d->name;
        }
    }
    return ciph;
}